

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::DynamicStruct::Reader::which
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,Reader *this)

{
  uint16_t discriminant;
  uint uVar1;
  Reader RStack_48;
  
  Schema::getProto(&RStack_48,(Schema *)this);
  if ((RStack_48._reader.dataSize < 0x100) || (*(short *)((long)RStack_48._reader.data + 0x1e) == 0)
     ) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    uVar1 = 0;
    if (0x11f < RStack_48._reader.dataSize) {
      uVar1 = *(uint *)((long)RStack_48._reader.data + 0x20);
    }
    if ((ulong)(this->reader).dataSize < (ulong)(uVar1 + 1) << 4) {
      discriminant = 0;
    }
    else {
      discriminant = *(uint16_t *)((long)(this->reader).data + (ulong)uVar1 * 2);
    }
    StructSchema::getFieldByDiscriminant(__return_storage_ptr__,&this->schema,discriminant);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> DynamicStruct::Reader::which() const {
  auto structProto = schema.getProto().getStruct();
  if (structProto.getDiscriminantCount() == 0) {
    return kj::none;
  }

  uint16_t discrim = reader.getDataField<uint16_t>(
      assumeDataOffset(structProto.getDiscriminantOffset()));
  return schema.getFieldByDiscriminant(discrim);
}